

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::SkipList
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,KeyComparator *cmp,
          Arena *arena)

{
  Node *pNVar1;
  int local_38;
  int i;
  char *local_28;
  Arena *local_20;
  Arena *arena_local;
  KeyComparator *cmp_local;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this_local;
  
  local_20 = arena;
  arena_local = (Arena *)cmp;
  cmp_local = &this->compare_;
  MemTable::KeyComparator::KeyComparator(&this->compare_,cmp);
  this->arena_ = local_20;
  local_28 = (char *)0x0;
  pNVar1 = NewNode(this,&local_28,0xc);
  this->head_ = pNVar1;
  std::atomic<int>::atomic(&this->max_height_,1);
  Random::Random(&this->rnd_,0xdeadbeef);
  for (local_38 = 0; local_38 < 0xc; local_38 = local_38 + 1) {
    Node::SetNext(this->head_,local_38,(Node *)0x0);
  }
  return;
}

Assistant:

SkipList<Key, Comparator>::SkipList(Comparator cmp, Arena* arena)
    : compare_(cmp),
      arena_(arena),
      head_(NewNode(0 /* any key will do */, kMaxHeight)),
      max_height_(1),
      rnd_(0xdeadbeef) {
  for (int i = 0; i < kMaxHeight; i++) {
    head_->SetNext(i, nullptr);
  }
}